

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Histogram(HistogramForm3 Histogram)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  uint8_t in_stack_ffffffffffffff36;
  uint8_t in_stack_ffffffffffffff37;
  byte bVar4;
  uint32_t *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 uVar5;
  uint32_t height;
  undefined8 in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  int local_7c;
  int local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_60 [40];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar1 = (uint)local_9;
  height = (uint32_t)((ulong)local_60 >> 0x20);
  uVar5 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff37,in_stack_ffffffffffffff36
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_ffffffffffffff58 >> 0x38),(uint32_t)in_stack_ffffffffffffff58
             ,height,(Image *)CONCAT44(uVar5,uVar1));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6f6f);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff28._M_current,(uint32_t *)0x1d6f90);
  (*local_8)(&local_98,local_38,local_70,local_74,local_78,local_7c);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
  in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff;
  if (sVar2 == 0x100) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_98,(ulong)local_9);
    in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff;
    if (*pvVar3 == local_78 * local_7c) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff28._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff28._M_current);
      __first._M_current._6_1_ = in_stack_ffffffffffffff36;
      __first._M_current._0_6_ = in_stack_ffffffffffffff30;
      __first._M_current._7_1_ = in_stack_ffffffffffffff37;
      in_stack_ffffffffffffff40 =
           std::
           accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                     (__first,in_stack_ffffffffffffff28,0);
      in_stack_ffffffffffffff44 =
           CONCAT13(in_stack_ffffffffffffff40 == local_78 * local_7c,(int3)in_stack_ffffffffffffff44
                   );
    }
  }
  bVar4 = (byte)(in_stack_ffffffffffffff44 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d7071);
  return (bool)(bVar4 & 1);
}

Assistant:

bool form3_Histogram(HistogramForm3 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const std::vector < uint32_t > histogram = Histogram( input, roiX, roiY, roiWidth, roiHeight );

        return histogram.size() == 256u && histogram[intensity] == roiWidth * roiHeight &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * roiHeight;
    }